

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Block * __thiscall
wasm::Builder::blockifyWithName
          (Builder *this,Expression *any,Name name,Expression *append,optional<wasm::Type> type)

{
  Name name_00;
  optional<wasm::Type> oVar1;
  bool bVar2;
  optional<wasm::Type> type_;
  Block *local_38;
  Block *block;
  Expression *append_local;
  Expression *any_local;
  Builder *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  local_38 = (Block *)0x0;
  if (any != (Expression *)0x0) {
    local_38 = Expression::dynCast<wasm::Block>(any);
  }
  if ((local_38 == (Block *)0x0) || (bVar2 = IString::is(&(local_38->name).super_IString), bVar2)) {
    name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)this_local;
    local_38 = makeBlock(this,name_00,any);
  }
  else {
    wasm::Name::operator=(&local_38->name,(Name *)&this_local);
  }
  if (append == (Expression *)0x0) {
    bVar2 = std::optional::operator_cast_to_bool((optional *)&type);
    if (!bVar2) {
      return local_38;
    }
  }
  else {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_38->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,append);
  }
  oVar1.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type> =
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  type = (optional<wasm::Type>)
         (optional<wasm::Type>)
         oVar1.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>;
  Block::finalize(local_38,type_,Unknown);
  return local_38;
}

Assistant:

Block* blockifyWithName(Expression* any,
                          Name name,
                          Expression* append = nullptr,
                          std::optional<Type> type = std::nullopt) {
    Block* block = nullptr;
    if (any) {
      block = any->dynCast<Block>();
    }
    if (!block || block->name.is()) {
      block = makeBlock(name, any);
    } else {
      block->name = name;
    }
    if (append) {
      block->list.push_back(append);
    }
    if (append || type) {
      block->finalize(type);
    }
    return block;
  }